

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

void background_work_sleep_once(tsdn_t *tsdn,background_thread_info_t *info,uint ind)

{
  background_thread_info_t *pbVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint i;
  arena_t *arena;
  ulong addend;
  nstime_t before_sleep;
  timespec ts;
  nstime_t ts_wakeup;
  nstime_t next_wakeup;
  timeval tv;
  nstime_t nStack_78;
  uint local_6c;
  background_thread_info_t *local_68;
  timespec local_60;
  nstime_t local_50;
  nstime_t local_48;
  timeval local_40;
  
  local_68 = info;
  uVar2 = narenas_total_get();
  addend = 0xffffffffffffffff;
  if (ind < uVar2) {
    addend = 0xffffffffffffffff;
    local_6c = uVar2;
    do {
      arena = (arena_t *)arenas[ind].repr;
      if (arena == (arena_t *)0x0) {
        arena = (arena_t *)0x0;
      }
      uVar5 = addend;
      if (arena != (arena_t *)0x0) {
        arena_decay(tsdn,arena,true,false);
        uVar5 = 100000000;
        if (addend != 100000000) {
          uVar4 = arena_decay_compute_purge_interval_impl
                            (tsdn,&arena->decay_dirty,&arena->extents_dirty);
          uVar5 = 100000000;
          if ((uVar4 != 100000000) &&
             (uVar5 = arena_decay_compute_purge_interval_impl
                                (tsdn,&arena->decay_muzzy,&arena->extents_muzzy), uVar4 < uVar5)) {
            uVar5 = uVar4;
          }
          uVar2 = local_6c;
          if (addend < uVar5) {
            uVar5 = addend;
          }
        }
      }
      addend = uVar5;
      ind = ind + (int)max_background_threads;
    } while (ind < uVar2);
  }
  pbVar1 = local_68;
  local_68->tot_n_runs = local_68->tot_n_runs + 1;
  local_68->npages_to_purge_new = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  nstime_init2(&nStack_78,local_40.tv_sec,local_40.tv_usec * 1000);
  if (addend == 0xffffffffffffffff) {
    pthread_cond_wait((pthread_cond_t *)&pbVar1->cond,
                      (pthread_mutex_t *)((long)&(pbVar1->mtx).field_0 + 0x40));
  }
  else {
    nstime_init(&local_48,0);
    nstime_update_impl(&local_48);
    nstime_iadd(&local_48,addend);
    uVar4 = nstime_ns(&local_48);
    (pbVar1->indefinite_sleep).repr = uVar4 == 0xffffffffffffffff;
    nstime_init(&pbVar1->next_wakeup,uVar4);
    nstime_copy(&local_50,&nStack_78);
    nstime_iadd(&local_50,addend);
    local_60.tv_sec = nstime_sec(&local_50);
    local_60.tv_nsec = nstime_nsec(&local_50);
    pthread_cond_timedwait
              ((pthread_cond_t *)&pbVar1->cond,
               (pthread_mutex_t *)((long)&(pbVar1->mtx).field_0 + 0x40),&local_60);
    (pbVar1->indefinite_sleep).repr = true;
    nstime_init(&pbVar1->next_wakeup,0xffffffffffffffff);
  }
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  nstime_init2((nstime_t *)&local_60,local_40.tv_sec,local_40.tv_usec * 1000);
  iVar3 = nstime_compare((nstime_t *)&local_60,&nStack_78);
  if (0 < iVar3) {
    nstime_subtract((nstime_t *)&local_60,&nStack_78);
    nstime_add(&pbVar1->tot_sleep_time,(nstime_t *)&local_60);
  }
  return;
}

Assistant:

static inline void
background_work_sleep_once(tsdn_t *tsdn, background_thread_info_t *info, unsigned ind) {
	uint64_t min_interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
	unsigned narenas = narenas_total_get();

	for (unsigned i = ind; i < narenas; i += max_background_threads) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		arena_decay(tsdn, arena, true, false);
		if (min_interval == BACKGROUND_THREAD_MIN_INTERVAL_NS) {
			/* Min interval will be used. */
			continue;
		}
		uint64_t interval = arena_decay_compute_purge_interval(tsdn,
		    arena);
		assert(interval >= BACKGROUND_THREAD_MIN_INTERVAL_NS);
		if (min_interval > interval) {
			min_interval = interval;
		}
	}
	background_thread_sleep(tsdn, info, min_interval);
}